

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

void __thiscall QLayout::isEmpty(QLayout *this)

{
  isEmpty((QLayout *)&this[-1].super_QLayoutItem);
  return;
}

Assistant:

bool QLayout::isEmpty() const
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (!item->isEmpty())
            return false;
        ++i;
        item = itemAt(i);
    }
    return true;
}